

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

Statement * __thiscall
rsg::BlockStatement::createNextChild(BlockStatement *this,GeneratorState *state)

{
  size_type sVar1;
  VariableManager *this_00;
  Statement *child;
  GeneratorState *state_local;
  BlockStatement *this_local;
  
  sVar1 = std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::size(&this->m_children);
  if ((int)sVar1 < this->m_numChildrenToCreate) {
    this_local = (BlockStatement *)rsg::anon_unknown_0::createStatement(state);
    addChild(this,(Statement *)this_local);
  }
  else {
    this_00 = GeneratorState::getVariableManager(state);
    VariableManager::popVariableScope(this_00);
    this_local = (BlockStatement *)0x0;
  }
  return &this_local->super_Statement;
}

Assistant:

Statement* BlockStatement::createNextChild (GeneratorState& state)
{
	if ((int)m_children.size() < m_numChildrenToCreate)
	{
		// Select and create a new child
		Statement* child = createStatement(state);
		addChild(child);
		return child;
	}
	else
	{
		// Done, pop scope
		state.getVariableManager().popVariableScope();
		return DE_NULL;
	}
}